

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O0

size_t IpmiFruWriteCommonAreas(FILE *ofd)

{
  size_t sVar1;
  byte local_19;
  uint8_t checksum;
  uint8_t running_offset;
  FILE *ofd_local;
  
  memset(&common_header,0,8);
  common_header.format_version = '\x01';
  local_19 = 1;
  if (chassis_info_area_size != 0) {
    common_header.chassis_info_area_offset = '\x01';
    local_19 = (char)(chassis_info_area_size >> 3) + 1;
  }
  if (board_info_area_size != 0) {
    common_header.board_info_area_offset = local_19;
    local_19 = local_19 + (char)(board_info_area_size >> 3);
  }
  if (product_info_area_size != 0) {
    common_header.product_info_area_offset = local_19;
    local_19 = local_19 + (char)(product_info_area_size >> 3);
  }
  common_header.multirecord_area_offset = local_19;
  common_header.checksum =
       -(common_header.chassis_info_area_offset + '\x01' + common_header.board_info_area_offset +
         common_header.product_info_area_offset + local_19);
  sVar1 = fwrite(&common_header,1,8,(FILE *)ofd);
  if (sVar1 == 0) {
    fprintf(_stderr,"Failed to write common header to the output file\n");
    ofd_local = (FILE *)0xffffffffffffffff;
  }
  else if ((chassis_info_area_size == 0) ||
          (sVar1 = fwrite(&chassis_info_area,1,(ulong)chassis_info_area_size,(FILE *)ofd),
          sVar1 != 0)) {
    if ((board_info_area_size == 0) ||
       (sVar1 = fwrite(&board_info_area,1,(ulong)board_info_area_size,(FILE *)ofd), sVar1 != 0)) {
      if ((product_info_area_size == 0) ||
         (sVar1 = fwrite(&product_info_area,1,(ulong)product_info_area_size,(FILE *)ofd), sVar1 != 0
         )) {
        ofd_local = (FILE *)((ulong)local_19 << 3);
      }
      else {
        fprintf(_stderr,"Failed to write product info to the output file\n");
        ofd_local = (FILE *)0xffffffffffffffff;
      }
    }
    else {
      fprintf(_stderr,"Failed to write board info to the output file\n");
      ofd_local = (FILE *)0xffffffffffffffff;
    }
  }
  else {
    fprintf(_stderr,"Failed to write chassis info to the output file\n");
    ofd_local = (FILE *)0xffffffffffffffff;
  }
  return (size_t)ofd_local;
}

Assistant:

size_t IpmiFruWriteCommonAreas(FILE *ofd)
{
    //  First, populate the common header
    memset(&common_header, 0, sizeof(common_header));
    common_header.format_version = IPMI_FRUINFO_FORMAT_VERSION;
    uint8_t running_offset = 1;
    if (chassis_info_area_size) {
        common_header.chassis_info_area_offset = running_offset;
        running_offset += chassis_info_area_size / 8;
    }
    if (board_info_area_size) {
        common_header.board_info_area_offset = running_offset;
        running_offset += board_info_area_size / 8;
    }
    if (product_info_area_size) {
        common_header.product_info_area_offset = running_offset;
        running_offset += product_info_area_size / 8;
    }
    common_header.multirecord_area_offset = running_offset;
    uint8_t checksum = 
        common_header.format_version +
        common_header.chassis_info_area_offset +
        common_header.board_info_area_offset +
        common_header.product_info_area_offset +
        common_header.multirecord_area_offset;
    common_header.checksum = -checksum;
    //  Write the common header
    if (fwrite(&common_header, 1, sizeof(common_header), ofd) <= 0) {
        fprintf(stderr, "Failed to write common header to the output file\n");
        return -1;
    }
    //  Write chassis info area
    if (chassis_info_area_size) {
        if (fwrite(&chassis_info_area, 1, chassis_info_area_size, ofd) <= 0) {
            fprintf(stderr, "Failed to write chassis info to the output file\n");
            return -1;
        }
    }
    //  Write board info area
    if (board_info_area_size) {
        if (fwrite(&board_info_area, 1, board_info_area_size, ofd) <= 0) {
            fprintf(stderr, "Failed to write board info to the output file\n");
            return -1;
        }
    }
    //  Write product info area
    if (product_info_area_size) {
        if (fwrite(&product_info_area, 1, product_info_area_size, ofd) <= 0) {
            fprintf(stderr, "Failed to write product info to the output file\n");
            return -1;
        }
    }
    return (size_t)running_offset * 8;
}